

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.h
# Opt level: O0

uint32_t __thiscall re2c::Enc::nCodePoints(Enc *this)

{
  Enc *this_local;
  
  if (this->type_ < UCS2) {
    this_local._4_4_ = 0x100;
  }
  else if (this->type_ == UCS2) {
    this_local._4_4_ = 0x10000;
  }
  else {
    this_local._4_4_ = 0x110000;
  }
  return this_local._4_4_;
}

Assistant:

inline uint32_t Enc::nCodePoints() const
{
	switch (type_)
	{
		case ASCII:
		case EBCDIC:	return 0x100;
		case UCS2:	return 0x10000;
		case UTF16:
		case UTF32:
		case UTF8:
		default:	return 0x110000;
	}
}